

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void gimage::imageSelect<unsigned_char,gimage::PixelTraits<unsigned_char>>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *ret,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,int j)

{
  long k;
  long lVar1;
  long lVar2;
  
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (ret,image->width,image->height,1);
  for (lVar1 = 0; lVar1 < image->height; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 < image->width; lVar2 = lVar2 + 1) {
      (*ret->img)[lVar1][lVar2] = image->img[j][lVar1][lVar2];
    }
  }
  return;
}

Assistant:

void imageSelect(Image<T, traits> &ret, const Image<T, traits> &image, int j)
{
  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      ret.set(i, k, 0, image.get(i, k, j));
    }
  }
}